

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_fs_window.c
# Opt level: O0

void redraw(void)

{
  undefined8 uVar1;
  float fVar2;
  ALLEGRO_FONT *pAVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  uint uVar10;
  char *pcVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ALLEGRO_COLOR white;
  float cy;
  float cx;
  int th;
  int ph;
  int pw;
  int h;
  int w;
  ALLEGRO_COLOR color;
  
  iVar4 = al_get_display_width(display);
  iVar5 = al_get_display_height(display);
  iVar6 = al_get_bitmap_width(picture);
  iVar7 = al_get_bitmap_height(picture);
  iVar8 = al_get_font_line_height(font);
  fVar2 = (float)(iVar5 - iVar7) * 0.5;
  uVar14 = 0x3f800000;
  uVar12 = al_map_rgb_f(0x3f800000);
  uVar15 = 0x3f333333;
  uVar13 = al_map_rgb_f(0x3f4ccccd,0x3f333333,0x3f666666);
  al_clear_to_color(uVar13);
  uVar1 = al_map_rgb(0xff,0);
  uVar13 = 0;
  al_draw_line(0,0,(float)iVar4,(float)iVar5,uVar1,uVar15);
  al_draw_line(0,CONCAT44(uVar13,(float)iVar5),(float)iVar4,0,uVar1,uVar15);
  al_draw_bitmap((float)(iVar4 - iVar6) * 0.5,fVar2,picture,0);
  al_draw_textf(uVar12,uVar14,(float)(iVar4 / 2),fVar2 + (float)iVar7,font,1,
                "Press Space to toggle fullscreen");
  al_draw_textf(uVar12,uVar14,(float)(iVar4 / 2),fVar2 + (float)iVar7 + (float)iVar8,font,1,
                "Press Enter to toggle window size");
  pAVar3 = font;
  uVar13 = al_get_display_width(display);
  uVar9 = al_get_display_height(display);
  uVar10 = al_get_display_flags(display);
  pcVar11 = "not fullscreen";
  if ((uVar10 & 0x200) != 0) {
    pcVar11 = "fullscreen";
  }
  al_draw_textf(uVar12,uVar14,(float)(iVar4 / 2),fVar2 + (float)iVar7 + (float)(iVar8 * 2),pAVar3,1,
                "Window: %dx%d (%s)",uVar13,uVar9,pcVar11);
  al_flip_display();
  return;
}

Assistant:

static void redraw(void)
{
   ALLEGRO_COLOR color;
   int w = al_get_display_width(display);
   int h = al_get_display_height(display);
   int pw = al_get_bitmap_width(picture);
   int ph = al_get_bitmap_height(picture);
   int th = al_get_font_line_height(font);
   float cx =  (w - pw) * 0.5;
   float cy =  (h - ph) * 0.5;
   ALLEGRO_COLOR white = al_map_rgb_f(1, 1, 1);

   color = al_map_rgb_f(0.8, 0.7, 0.9);
   al_clear_to_color(color);

   color = al_map_rgb(255, 0, 0);
   al_draw_line(0, 0, w, h, color, 0);
   al_draw_line(0, h, w, 0, color, 0);

   al_draw_bitmap(picture, cx, cy, 0);
   
   al_draw_textf(font, white, w / 2, cy + ph, ALLEGRO_ALIGN_CENTRE,
      "Press Space to toggle fullscreen");
   al_draw_textf(font, white, w / 2, cy + ph + th, ALLEGRO_ALIGN_CENTRE,
      "Press Enter to toggle window size");
   al_draw_textf(font, white, w / 2, cy + ph + th * 2, ALLEGRO_ALIGN_CENTRE,
      "Window: %dx%d (%s)",
      al_get_display_width(display), al_get_display_height(display),
      (al_get_display_flags(display) & ALLEGRO_FULLSCREEN_WINDOW) ?
      "fullscreen" : "not fullscreen");
   
   al_flip_display();
}